

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::Validator::validate
          (Validator *this,Reader *type,Reader *value,uint *dataSizeInBits,bool *isPointer)

{
  uint uVar1;
  Which WVar2;
  uint uVar3;
  bool bVar4;
  Which local_62;
  uint local_60;
  uint local_5c;
  DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which_&> _kjCondition;
  Fault f;
  
  validate(this,type);
  if ((type->_reader).dataSize < 0x10) {
switchD_0017aa8d_caseD_0:
    local_62 = VOID;
    uVar3 = 0;
    bVar4 = false;
    WVar2 = VOID;
    goto LAB_0017aba5;
  }
  switch(*(type->_reader).data) {
  case 0:
    goto switchD_0017aa8d_caseD_0;
  case 1:
    local_62 = BOOL;
    WVar2 = BOOL;
    uVar3 = 1;
    goto LAB_0017aba3;
  case 2:
    local_62 = INT8;
    WVar2 = INT8;
    goto LAB_0017ab6e;
  case 3:
    local_62 = INT16;
    WVar2 = INT16;
    goto LAB_0017ab30;
  case 4:
    local_62 = INT32;
    WVar2 = INT32;
    goto LAB_0017ab9e;
  case 5:
    local_62 = INT64;
    WVar2 = INT64;
    goto LAB_0017ab4f;
  case 6:
    local_62 = UINT8;
    WVar2 = UINT8;
LAB_0017ab6e:
    uVar3 = 8;
    goto LAB_0017aba3;
  case 7:
    local_62 = UINT16;
    WVar2 = UINT16;
    goto LAB_0017ab30;
  case 8:
    local_62 = UINT32;
    WVar2 = UINT32;
    goto LAB_0017ab9e;
  case 9:
    local_62 = UINT64;
    WVar2 = UINT64;
    goto LAB_0017ab4f;
  case 10:
    local_62 = FLOAT32;
    WVar2 = FLOAT32;
LAB_0017ab9e:
    uVar3 = 0x20;
    goto LAB_0017aba3;
  case 0xb:
    local_62 = FLOAT64;
    WVar2 = FLOAT64;
LAB_0017ab4f:
    uVar3 = 0x40;
    goto LAB_0017aba3;
  case 0xc:
    local_62 = TEXT;
    WVar2 = TEXT;
    break;
  case 0xd:
    local_62 = DATA;
    WVar2 = DATA;
    break;
  case 0xe:
    local_62 = LIST;
    WVar2 = LIST;
    break;
  case 0xf:
    local_62 = ENUM;
    WVar2 = ENUM;
LAB_0017ab30:
    uVar3 = 0x10;
LAB_0017aba3:
    bVar4 = false;
    goto LAB_0017aba5;
  case 0x10:
    local_62 = STRUCT;
    WVar2 = STRUCT;
    break;
  case 0x11:
    local_62 = INTERFACE;
    WVar2 = INTERFACE;
    break;
  case 0x12:
    local_62 = ANY_POINTER;
    WVar2 = ANY_POINTER;
    break;
  default:
    goto switchD_0017aa8d_default;
  }
  bVar4 = true;
  uVar3 = 0;
LAB_0017aba5:
  *dataSizeInBits = uVar3;
  *isPointer = bVar4;
  uVar1 = (value->_reader).dataSize;
  if (uVar1 < 0x10) {
    _kjCondition.left = VOID;
  }
  else {
    _kjCondition.left = *(value->_reader).data;
  }
  _kjCondition.right = &local_62;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == WVar2;
  if (!_kjCondition.result) {
    local_5c = 0;
    if (0xf < uVar1) {
      local_5c = (uint)*(value->_reader).data;
    }
    local_60 = (uint)WVar2;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Value::Which,capnp::schema::Value::Which&>&,char_const(&)[26],unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,500,FAILED,"value.which() == expectedValueType",
               "_kjCondition,\"Value did not match type.\", (uint)value.which(), (uint)expectedValueType"
               ,&_kjCondition,(char (*) [26])"Value did not match type.",&local_5c,&local_60);
    this->isValid = false;
    kj::_::Debug::Fault::~Fault(&f);
  }
switchD_0017aa8d_default:
  return;
}

Assistant:

void validate(const schema::Type::Reader& type, const schema::Value::Reader& value,
                uint* dataSizeInBits, bool* isPointer) {
    validate(type);

    schema::Value::Which expectedValueType = schema::Value::VOID;
    bool hadCase = false;
    switch (type.which()) {
#define HANDLE_TYPE(name, bits, ptr) \
      case schema::Type::name: \
        expectedValueType = schema::Value::name; \
        *dataSizeInBits = bits; *isPointer = ptr; \
        hadCase = true; \
        break;
      HANDLE_TYPE(VOID, 0, false)
      HANDLE_TYPE(BOOL, 1, false)
      HANDLE_TYPE(INT8, 8, false)
      HANDLE_TYPE(INT16, 16, false)
      HANDLE_TYPE(INT32, 32, false)
      HANDLE_TYPE(INT64, 64, false)
      HANDLE_TYPE(UINT8, 8, false)
      HANDLE_TYPE(UINT16, 16, false)
      HANDLE_TYPE(UINT32, 32, false)
      HANDLE_TYPE(UINT64, 64, false)
      HANDLE_TYPE(FLOAT32, 32, false)
      HANDLE_TYPE(FLOAT64, 64, false)
      HANDLE_TYPE(TEXT, 0, true)
      HANDLE_TYPE(DATA, 0, true)
      HANDLE_TYPE(LIST, 0, true)
      HANDLE_TYPE(ENUM, 16, false)
      HANDLE_TYPE(STRUCT, 0, true)
      HANDLE_TYPE(INTERFACE, 0, true)
      HANDLE_TYPE(ANY_POINTER, 0, true)
#undef HANDLE_TYPE
    }

    if (hadCase) {
      VALIDATE_SCHEMA(value.which() == expectedValueType, "Value did not match type.",
                      (uint)value.which(), (uint)expectedValueType);
    }
  }